

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flic.cc
# Opt level: O0

void __thiscall Flic::readBrun(Flic *this,FlicHeader *header,FlicFrame *frame,istream *is)

{
  void *pvVar1;
  ulong uVar2;
  char *tmp_1;
  int j_1;
  int j;
  char *tmp;
  int iStack_38;
  char count;
  int offset;
  int x;
  uint uStack_2c;
  uint8_t packets;
  int y;
  int bytespp;
  istream *is_local;
  FlicFrame *frame_local;
  FlicHeader *header_local;
  Flic *this_local;
  
  uStack_2c = header->depth / 8;
  _y = is;
  is_local = (istream *)frame;
  frame_local = (FlicFrame *)header;
  header_local = (FlicHeader *)this;
  for (x = 0; x < (int)(uint)*(ushort *)((long)&frame_local[1].pixels + 2); x = x + 1) {
    std::istream::read((char *)_y,(long)&offset + 3);
    iStack_38 = 0;
    while (iStack_38 < (int)(uint)*(ushort *)&frame_local[1].pixels) {
      tmp._4_4_ = ((((uint)*(ushort *)((long)&frame_local[1].pixels + 2) - x) + -1) *
                   (uint)*(ushort *)&frame_local[1].pixels + iStack_38) * uStack_2c;
      std::istream::read((char *)_y,(long)&tmp + 3);
      if (tmp._3_1_ < '\0') {
        for (tmp_1._0_4_ = 0; SBORROW4((int)tmp_1,-(int)tmp._3_1_) != (int)tmp_1 + tmp._3_1_ < 0;
            tmp_1._0_4_ = (int)tmp_1 + 1) {
          uVar2 = (ulong)(int)uStack_2c;
          if ((long)uVar2 < 0) {
            uVar2 = 0xffffffffffffffff;
          }
          pvVar1 = operator_new__(uVar2);
          std::istream::read((char *)_y,(long)pvVar1);
          memcpy((void *)(*(long *)is_local + (long)tmp._4_4_ + (long)(int)((int)tmp_1 * uStack_2c))
                 ,pvVar1,(long)(int)uStack_2c);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1);
          }
        }
        iStack_38 = iStack_38 - tmp._3_1_;
      }
      else {
        uVar2 = (ulong)(int)uStack_2c;
        if ((long)uVar2 < 0) {
          uVar2 = 0xffffffffffffffff;
        }
        pvVar1 = operator_new__(uVar2);
        std::istream::read((char *)_y,(long)pvVar1);
        for (tmp_1._4_4_ = 0; tmp_1._4_4_ < tmp._3_1_; tmp_1._4_4_ = tmp_1._4_4_ + 1) {
          memcpy((void *)(*(long *)is_local + (long)tmp._4_4_ + (long)(int)(tmp_1._4_4_ * uStack_2c)
                         ),pvVar1,(long)(int)uStack_2c);
        }
        iStack_38 = tmp._3_1_ + iStack_38;
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1);
        }
      }
    }
  }
  return;
}

Assistant:

void Flic::readBrun(const FlicHeader &header, FlicFrame &frame, std::istream &is) {
	int bytespp = header.depth / 8;
	for (int y = 0; y < header.height; ++y) {
		uint8_t packets;
		is.read(reinterpret_cast<char*>(&packets), 1);
		int x = 0;
		while (x < header.width) {
			int offset = ((header.height - y - 1) * header.width + x) * bytespp;
			char count;
			is.read(&count, 1);
			if (count >= 0) {
				char *tmp = new char[bytespp];
				is.read(tmp, bytespp);
				for (int j = 0; j < count; ++j) {
					memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
				}
				x += count;
				delete tmp;
			} else {
				for (int j = 0; j < (-count); ++j) {
					char *tmp = new char[bytespp];
					is.read(tmp, bytespp);
					memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
					delete tmp;
				}
				x += -count;
			}
		}
	}
}